

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O3

bool __thiscall ircBot::checkping(ircBot *this,char *buff)

{
  int __fd;
  bool bVar1;
  int x;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  char Pingout [60];
  char local_78 [72];
  
  if (*buff != '\0') {
    uVar5 = 0;
    pcVar4 = buff;
    do {
      if (buff[uVar5] == 'P') {
        found = true;
        lVar2 = 1;
        do {
          if (pcVar4[lVar2] != "PING "[lVar2]) {
            found = false;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
      }
      uVar5 = uVar5 + 1;
      sVar3 = strlen(buff);
      pcVar4 = pcVar4 + 1;
    } while (uVar5 < sVar3);
  }
  printf("\n%s\n",buff);
  bVar1 = found;
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  if (found != false) {
    snprintf(local_78,0x3c,"PONG :%s\r\n");
    __fd = this->sock;
    sVar3 = strlen(local_78);
    send(__fd,local_78,sVar3,0);
    printf("PONG: %s\r\n\n",irchost);
  }
  return bVar1;
}

Assistant:

bool ircBot::checkping(char *buff)
{
    
    const char * toSearch = "PING ";

    for (int i = 0; i < strlen(buff);i++) {
    //If the active char is equil to the first search item then search toSearch
            if (buff[i] == toSearch[0]) {
                found = true;
                //search the char array for search field
                for (int x = 1; x < 4; x++) {
                    if (buff[i+x]!=toSearch[x]) {
                    found = false;
                    }
                }
            }
    }

    printf("\n%s\n", buff);
    char Pingout[60];
    memset(Pingout,'\0',60);
    if(found == true)
    {
        snprintf(Pingout,60,"PONG :%s\r\n",buff);
        send(sock,Pingout,strlen(Pingout),0);
        printf("PONG: %s\r\n\n", irchost);
        return 1;
    }
    return 0;
}